

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O1

void column_test_common_content_access<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>>*,8ul,void,void>>,std::pair<unsigned_int,unsigned_int>>
               (Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL,_void,_void>_>
                *col,set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                     *setcont,vector<unsigned_int,_std::allocator<unsigned_int>_> *veccont)

{
  uint uVar1;
  stored_size_type sVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  pointer puVar6;
  pointer ppEVar7;
  ulong uVar8;
  uint uVar9;
  Entry entry;
  _Rb_tree_node_base local_238;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_210;
  undefined **local_208;
  ulong local_200;
  shared_count sStack_1f8;
  _Base_ptr local_1f0;
  _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::_Identity<std::pair<unsigned_int,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_1e8;
  _Rb_tree_node_base local_1b8;
  char *local_198;
  char *local_190;
  char *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  size_t local_130;
  size_t local_128;
  size_t *local_120;
  size_t *local_118;
  char *local_110;
  _Base_ptr local_108;
  _Base_ptr local_100;
  undefined1 *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  local_210 = veccont;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x11d);
  get_column_content_via_iterators<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>>*,8ul,void,void>>>
            ((column_content<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_8UL>_>_>
              *)&local_1e8,col);
  if (local_1e8._M_impl.super__Rb_tree_header._M_node_count ==
      (setcont->_M_t)._M_impl.super__Rb_tree_header._M_node_count) {
    bVar3 = std::__equal<false>::
            equal<std::_Rb_tree_const_iterator<std::pair<unsigned_int,unsigned_int>>,std::_Rb_tree_const_iterator<std::pair<unsigned_int,unsigned_int>>>
                      ((_Rb_tree_const_iterator<std::pair<unsigned_int,_unsigned_int>_>)
                       local_1e8._M_impl.super__Rb_tree_header._M_header._M_left,
                       (_Rb_tree_const_iterator<std::pair<unsigned_int,_unsigned_int>_>)
                       &local_1e8._M_impl.super__Rb_tree_header,
                       (setcont->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left);
  }
  else {
    bVar3 = false;
  }
  local_238._M_color._0_1_ = bVar3;
  local_238._M_parent = (_Base_ptr)0x0;
  local_238._M_left = (_Base_ptr)0x0;
  local_1b8._0_8_ = "get_column_content_via_iterators(col) == setcont";
  local_1b8._M_parent = (_Base_ptr)0x197dbb;
  local_200 = local_200 & 0xffffffffffffff00;
  local_208 = &PTR__lazy_ostream_001b97f0;
  sStack_1f8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_58 = "";
  local_1f0 = &local_1b8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)&local_238._M_left);
  std::
  _Rb_tree<std::pair<unsigned_int,_unsigned_int>,_std::pair<unsigned_int,_unsigned_int>,_std::_Identity<std::pair<unsigned_int,_unsigned_int>_>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Rb_tree(&local_1e8);
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x11e);
  uVar9 = (uint)((ulong)((long)(local_210->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(local_210->
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                              _M_impl.super__Vector_impl_data._M_start) >> 2);
  if ((int)uVar9 < 0) {
    sVar2 = (col->column_).
            super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
            .super_type.m_holder.m_size;
    if (sVar2 == 0) {
      local_238._0_8_ = (_Base_ptr)0x0;
      local_238._M_parent = (_Base_ptr)0x0;
      local_238._M_left = (_Base_ptr)0x0;
      goto LAB_001396e5;
    }
    uVar9 = (col->column_).
            super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
            .super_type.m_holder.m_start[sVar2 - 1]->rowIndex_ + 1;
  }
  local_1e8._M_impl._0_8_ = local_1e8._M_impl._0_8_ & 0xffffffff00000000;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_238,(long)(int)uVar9,
             (value_type_conflict *)&local_1e8,(allocator_type *)&local_1b8);
  sVar2 = (col->column_).
          super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
          .super_type.m_holder.m_size;
  if (sVar2 != 0) {
    ppEVar7 = (col->column_).
              super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
              .super_type.m_holder.m_start;
    lVar5 = sVar2 << 3;
    do {
      if (ppEVar7 == (pointer)0x0) {
        __assert_fail("!!m_ptr","/usr/include/boost/container/vector.hpp",0x8e,
                      "reference boost::container::vec_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false, Gudhi::persistence_matrix::Column_types::SMALL_VECTOR, false, false, false>>> **, true>::operator*() const [Pointer = Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false, Gudhi::persistence_matrix::Column_types::SMALL_VECTOR, false, false, false>>> **, IsConst = true]"
                     );
      }
      uVar1 = (*ppEVar7)->rowIndex_;
      if (uVar9 <= uVar1) break;
      ((_Rb_tree_color *)local_238._0_8_)[uVar1] =
           ((*ppEVar7)->super_Entry_field_element_option).element_;
      ppEVar7 = ppEVar7 + 1;
      lVar5 = lVar5 + -8;
    } while (lVar5 != 0);
  }
LAB_001396e5:
  puVar6 = (local_210->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)local_238._M_parent - local_238._0_8_ ==
      (long)(local_210->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)puVar6) {
    if (local_238._M_parent == (_Base_ptr)local_238._0_8_) {
      bVar3 = true;
    }
    else {
      iVar4 = bcmp((void *)local_238._0_8_,puVar6,(long)local_238._M_parent - local_238._0_8_);
      bVar3 = iVar4 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  local_208 = (undefined **)CONCAT71(local_208._1_7_,bVar3);
  local_200 = 0;
  sStack_1f8.pi_ = (sp_counted_base *)0x0;
  local_1b8._0_8_ = "col.get_content(veccont.size()) == veccont";
  local_1b8._M_parent = (_Base_ptr)0x197de6;
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  local_1e8._M_impl._0_8_ = &PTR__lazy_ostream_001b97f0;
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_88 = "";
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_left = &local_1b8;
  boost::test_tools::tt_detail::report_assertion(&local_208,&local_1e8,&local_90,0x11e,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_1f8);
  if ((_Base_ptr)local_238._0_8_ != (_Base_ptr)0x0) {
    operator_delete((void *)local_238._0_8_,(long)local_238._M_left - local_238._0_8_);
  }
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x120);
  local_238._M_parent = (_Base_ptr)((ulong)local_238._M_parent & 0xffffffffffffff00);
  local_238._0_8_ = &PTR__lazy_ostream_001b97b0;
  local_238._M_left = (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_238._M_right = (_Base_ptr)0x19425b;
  local_128 = (col->column_).
              super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
              .super_type.m_holder.m_size;
  local_118 = &local_128;
  local_130 = (setcont->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  local_1b8._M_color._0_1_ = local_128 == local_130;
  local_120 = &local_130;
  local_1b8._M_parent = (_Base_ptr)0x0;
  local_1b8._M_left = (_Base_ptr)0x0;
  local_1b8._M_right = (_Base_ptr)0x1942dd;
  local_198 = "";
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)&local_118;
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
  local_1e8._M_impl._0_8_ = &PTR__lazy_ostream_001b96f8;
  local_1e8._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
  local_1f0 = (_Base_ptr)&local_120;
  local_200 = local_200 & 0xffffffffffffff00;
  local_208 = &PTR__lazy_ostream_001b96f8;
  sStack_1f8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)&local_1b8._M_left);
  if ((local_210->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (local_210->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    local_c0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_b8 = "";
    local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x124);
    local_208 = (undefined **)
                CONCAT71(local_208._1_7_,
                         (col->column_).
                         super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
                         .super_type.m_holder.m_size == 0);
    local_200 = 0;
    sStack_1f8.pi_ = (sp_counted_base *)0x0;
    local_238._0_8_ = "col.is_empty()";
    local_238._M_parent = (_Base_ptr)0x197e05;
    local_1e8._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
    local_1e8._M_impl._0_8_ = &PTR__lazy_ostream_001b97f0;
    local_1e8._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
    local_1e8._M_impl.super__Rb_tree_header._M_header._M_left = &local_238;
    local_e0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_d8 = "";
    boost::test_tools::tt_detail::report_assertion();
  }
  else {
    local_f0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_e8 = "";
    local_100 = (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
    local_f8 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f0,0x126);
    local_208 = (undefined **)
                CONCAT71(local_208._1_7_,
                         (col->column_).
                         super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
                         .super_type.m_holder.m_size != 0);
    local_200 = 0;
    sStack_1f8.pi_ = (sp_counted_base *)0x0;
    local_238._0_8_ = "!col.is_empty()";
    local_238._M_parent = (_Base_ptr)0x197e05;
    local_1e8._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
    local_1e8._M_impl._0_8_ = &PTR__lazy_ostream_001b97f0;
    local_1e8._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
    local_1e8._M_impl.super__Rb_tree_header._M_header._M_left = &local_238;
    local_110 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
    ;
    local_108 = (_Base_ptr)0x194350;
    boost::test_tools::tt_detail::report_assertion();
  }
  boost::detail::shared_count::~shared_count(&sStack_1f8);
  puVar6 = (local_210->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((local_210->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar6) {
    uVar9 = 1;
    uVar8 = 0;
    do {
      if (puVar6[uVar8] == 0) {
        local_140 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_138 = "";
        local_150 = &boost::unit_test::basic_cstring<char_const>::null;
        local_148 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,0x12a,
                   &local_150);
        local_1e8._M_impl._0_8_ = (ulong)(uVar9 - 1) << 0x20;
        local_238._0_8_ =
             (col->column_).
             super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
             .super_type.m_holder.m_start;
        local_1b8._0_8_ =
             (long)&((_Base_ptr)local_238._0_8_)->_M_color +
             (col->column_).
             super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
             .super_type.m_holder.m_size * 8;
        local_1b8._M_right = (_Base_ptr)&local_1e8;
        bVar3 = std::
                binary_search<boost::container::vec_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>>**,true>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>>*,Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>>*,8ul,void,void>>::is_non_zero(unsigned_int)const::_lambda(Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>>const*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>>const*)_1_>
                          (&local_238,&local_1b8,&local_1b8._M_right);
        local_208 = (undefined **)CONCAT71(local_208._1_7_,!bVar3);
        local_200 = 0;
        sStack_1f8.pi_ = (sp_counted_base *)0x0;
        local_238._0_8_ = "!col.is_non_zero(i)";
        local_238._M_parent = (_Base_ptr)0x197e19;
        local_1e8._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
        local_1e8._M_impl._0_8_ = &PTR__lazy_ostream_001b97f0;
        local_1e8._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
        local_160 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_158 = "";
        local_1e8._M_impl.super__Rb_tree_header._M_header._M_left = &local_238;
        boost::test_tools::tt_detail::report_assertion
                  (&local_208,(_Base_ptr)&local_1e8,&local_160,0x12a,1,0,0);
      }
      else {
        local_170 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_168 = "";
        local_180 = &boost::unit_test::basic_cstring<char_const>::null;
        local_178 = &boost::unit_test::basic_cstring<char_const>::null;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_170,300,&local_180)
        ;
        local_1e8._M_impl._0_8_ = (ulong)(uVar9 - 1) << 0x20;
        local_238._0_8_ =
             (col->column_).
             super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
             .super_type.m_holder.m_start;
        local_1b8._0_8_ =
             (long)&((_Base_ptr)local_238._0_8_)->_M_color +
             (col->column_).
             super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)5,_false,_false,_false>_>_>_*,_void,_void>
             .super_type.m_holder.m_size * 8;
        local_1b8._M_right = (_Base_ptr)&local_1e8;
        bVar3 = std::
                binary_search<boost::container::vec_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>>**,true>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>>*,Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>>*,8ul,void,void>>::is_non_zero(unsigned_int)const::_lambda(Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>>const*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)5,false,false,false>>>const*)_1_>
                          (&local_238,&local_1b8,&local_1b8._M_right);
        local_208 = (undefined **)CONCAT71(local_208._1_7_,bVar3);
        local_200 = 0;
        sStack_1f8.pi_ = (sp_counted_base *)0x0;
        local_238._0_8_ = "col.is_non_zero(i)";
        local_238._M_parent = (_Base_ptr)0x197e19;
        local_1e8._M_impl.super__Rb_tree_header._M_header._M_color._0_1_ = _S_red;
        local_1e8._M_impl._0_8_ = &PTR__lazy_ostream_001b97f0;
        local_1e8._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)&boost::unit_test::lazy_ostream::inst;
        local_190 = 
        "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
        ;
        local_188 = "";
        local_1e8._M_impl.super__Rb_tree_header._M_header._M_left = &local_238;
        boost::test_tools::tt_detail::report_assertion
                  (&local_208,(_Base_ptr)&local_1e8,&local_190,300,1,0,0);
      }
      boost::detail::shared_count::~shared_count(&sStack_1f8);
      uVar8 = (ulong)uVar9;
      puVar6 = (local_210->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar9 = uVar9 + 1;
    } while (uVar8 < (ulong)((long)(local_210->
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar6 >> 2));
  }
  return;
}

Assistant:

void column_test_common_content_access(Column& col,
                                       const std::set<entry_type>& setcont,
                                       const std::vector<typename Column::Field_element>& veccont) {
  BOOST_CHECK(get_column_content_via_iterators(col) == setcont);
  BOOST_CHECK(col.get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(col.size(), setcont.size());
  }

  if (veccont.empty())
    BOOST_CHECK(col.is_empty());
  else
    BOOST_CHECK(!col.is_empty());

  for (unsigned int i = 0; i < veccont.size(); ++i) {
    if (veccont[i] == 0u)
      BOOST_CHECK(!col.is_non_zero(i));
    else
      BOOST_CHECK(col.is_non_zero(i));
  }
}